

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O1

float __thiscall
pbrt::MIPMap::EWA<float>(MIPMap *this,int level,Point2f st,Vector2f dst0,Vector2f dst1)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  int iVar5;
  Point2i PVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  Float FVar11;
  float fVar12;
  undefined8 in_XMM0_Qb;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 extraout_var [60];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  float fVar18;
  undefined8 in_XMM1_Qb;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined8 in_XMM2_Qb;
  undefined1 auVar23 [64];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 auVar15 [16];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  iVar7 = (int)(this->pyramid).nStored;
  if (level < iVar7) {
    local_78 = st.super_Tuple2<pbrt::Point2,_float>.x;
    PVar6 = LevelResolution(this,level);
    auVar2._8_8_ = in_XMM0_Qb;
    auVar2._0_8_ = st.super_Tuple2<pbrt::Point2,_float>;
    auVar15 = vmovshdup_avx(auVar2);
    auVar13._8_8_ = 0;
    auVar13._0_4_ = PVar6.super_Tuple2<pbrt::Point2,_int>.x;
    auVar13._4_4_ = PVar6.super_Tuple2<pbrt::Point2,_int>.y;
    auVar2 = vcvtdq2ps_avx(auVar13);
    auVar3 = vmovshdup_avx(auVar2);
    local_98 = dst0.super_Tuple2<pbrt::Vector2,_float>.x;
    fStack_94 = dst0.super_Tuple2<pbrt::Vector2,_float>.y;
    fStack_90 = (float)in_XMM1_Qb;
    fStack_8c = (float)((ulong)in_XMM1_Qb >> 0x20);
    auVar14._0_4_ = auVar2._0_4_ * local_98;
    auVar14._4_4_ = auVar2._4_4_ * fStack_94;
    auVar14._8_4_ = auVar2._8_4_ * fStack_90;
    auVar14._12_4_ = auVar2._12_4_ * fStack_8c;
    local_68 = dst1.super_Tuple2<pbrt::Vector2,_float>.x;
    fStack_64 = dst1.super_Tuple2<pbrt::Vector2,_float>.y;
    fStack_60 = (float)in_XMM2_Qb;
    fStack_5c = (float)((ulong)in_XMM2_Qb >> 0x20);
    auVar19._0_4_ = auVar2._0_4_ * local_68;
    auVar19._4_4_ = auVar2._4_4_ * fStack_64;
    auVar19._8_4_ = auVar2._8_4_ * fStack_60;
    auVar19._12_4_ = auVar2._12_4_ * fStack_5c;
    auVar13 = vmovshdup_avx(auVar19);
    auVar10 = vmovshdup_avx(auVar14);
    auVar13 = vfmadd213ss_fma(auVar10,auVar14,ZEXT416((uint)(auVar19._0_4_ * auVar13._0_4_)));
    fVar4 = auVar13._0_4_ * -2.0;
    auVar20._0_4_ = auVar19._0_4_ * auVar19._0_4_;
    auVar20._4_4_ = auVar19._4_4_ * auVar19._4_4_;
    auVar20._8_4_ = auVar19._8_4_ * auVar19._8_4_;
    auVar20._12_4_ = auVar19._12_4_ * auVar19._12_4_;
    auVar13 = vfmadd231ps_fma(auVar20,auVar14,auVar14);
    auVar10._8_4_ = 0x3f800000;
    auVar10._0_8_ = 0x3f8000003f800000;
    auVar10._12_4_ = 0x3f800000;
    auVar10 = vaddps_avx512vl(auVar13,auVar10);
    auVar13 = vmovshdup_avx(auVar10);
    auVar13 = vfmadd213ss_fma(auVar13,auVar10,ZEXT416((uint)(fVar4 * fVar4 * -0.25)));
    fVar18 = 1.0 / auVar13._0_4_;
    fVar4 = fVar4 * fVar18;
    auVar21._0_4_ = auVar10._0_4_ * fVar18;
    auVar21._4_4_ = auVar10._4_4_ * fVar18;
    auVar21._8_4_ = auVar10._8_4_ * fVar18;
    auVar21._12_4_ = auVar10._12_4_ * fVar18;
    auVar13 = vmovshdup_avx(auVar21);
    fVar18 = auVar13._0_4_;
    auVar13 = vfnmadd231ss_fma(ZEXT416((uint)(auVar21._0_4_ * fVar18 * 4.0)),ZEXT416((uint)fVar4),
                               ZEXT416((uint)fVar4));
    fVar12 = auVar13._0_4_;
    auVar22._12_4_ = 0;
    auVar22._0_12_ = ZEXT412(0);
    auVar22 = auVar22 << 0x20;
    auVar13 = vmaxss_avx(ZEXT416((uint)(auVar21._0_4_ * fVar12)),auVar22);
    if (auVar13._0_4_ < 0.0) {
      auVar23._0_4_ = sqrtf(auVar13._0_4_);
      auVar23._4_60_ = extraout_var;
      auVar22 = ZEXT816(0) << 0x40;
      auVar13 = auVar23._0_16_;
    }
    else {
      auVar13 = vsqrtss_avx(auVar13,auVar13);
    }
    auVar3 = vfmadd213ss_fma(auVar3,auVar15,SUB6416(ZEXT464(0xbf000000),0));
    auVar15 = vmaxss_avx(ZEXT416((uint)(fVar12 * fVar18)),auVar22);
    if (auVar15._0_4_ < 0.0) {
      auVar16._0_4_ = sqrtf(auVar15._0_4_);
      auVar16._4_60_ = extraout_var_00;
      auVar15 = auVar16._0_16_;
      auVar13 = ZEXT416(auVar13._0_4_);
    }
    else {
      auVar15 = vsqrtss_avx(auVar15,auVar15);
    }
    fVar12 = 1.0 / fVar12 + 1.0 / fVar12;
    auVar10 = vfnmadd213ss_fma(auVar15,ZEXT416((uint)fVar12),auVar3);
    auVar10 = vroundss_avx(auVar10,auVar10,10);
    auVar15 = vfmadd213ss_fma(auVar15,ZEXT416((uint)fVar12),auVar3);
    auVar15 = vroundss_avx(auVar15,auVar15,9);
    if ((int)auVar15._0_4_ < (int)auVar10._0_4_) {
      fVar12 = NAN;
    }
    else {
      auVar22 = vfmadd132ss_fma(auVar2,SUB6416(ZEXT464(0xbf000000),0),ZEXT416((uint)local_78));
      auVar2 = vfnmadd213ss_fma(auVar13,ZEXT416((uint)fVar12),auVar22);
      auVar2 = vroundss_avx(auVar2,auVar2,10);
      auVar13 = vfmadd213ss_fma(auVar13,ZEXT416((uint)fVar12),auVar22);
      auVar13 = vroundss_avx(auVar13,auVar13,9);
      auVar23 = ZEXT864(0) << 0x20;
      fVar12 = 0.0;
      iVar7 = (int)auVar10._0_4_;
      do {
        if ((int)auVar2._0_4_ <= (int)auVar13._0_4_) {
          local_88 = auVar3._0_4_;
          local_88 = (float)iVar7 - local_88;
          iVar8 = (int)auVar2._0_4_;
          do {
            local_98 = auVar22._0_4_;
            local_98 = (float)iVar8 - local_98;
            auVar10 = vfmadd231ss_fma(ZEXT416((uint)(local_88 * local_98 * fVar4)),
                                      ZEXT416((uint)local_98),ZEXT416((uint)(local_98 * fVar18)));
            auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)(local_88 * auVar21._0_4_)),
                                      ZEXT416((uint)local_88));
            if (auVar10._0_4_ < 1.0) {
              iVar5 = (int)(auVar10._0_4_ * 128.0);
              if (0x7e < iVar5) {
                iVar5 = 0x7f;
              }
              fVar1 = *(float *)(MIPFilterLUT + (long)iVar5 * 4);
              PVar6.super_Tuple2<pbrt::Point2,_int>.y = iVar7;
              PVar6.super_Tuple2<pbrt::Point2,_int>.x = iVar8;
              auVar17._0_4_ = Texel<float>(this,level,PVar6);
              auVar17._4_60_ = extraout_var_01;
              auVar10 = vfmadd231ss_fma(ZEXT416(auVar23._0_4_),ZEXT416((uint)fVar1),auVar17._0_16_);
              auVar23 = ZEXT1664(auVar10);
              fVar12 = fVar12 + fVar1;
            }
            iVar8 = iVar8 + 1;
          } while ((int)auVar13._0_4_ + 1 != iVar8);
        }
        bVar9 = iVar7 != (int)auVar15._0_4_;
        iVar7 = iVar7 + 1;
      } while (bVar9);
      fVar12 = auVar23._0_4_ / fVar12;
    }
    return fVar12;
  }
  FVar11 = Texel<float>(this,iVar7 + -1,(Point2i)0x0);
  return FVar11;
}

Assistant:

T MIPMap::EWA(int level, Point2f st, Vector2f dst0, Vector2f dst1) const {
    if (level >= Levels())
        return Texel<T>(Levels() - 1, {0, 0});
    // Convert EWA coordinates to appropriate scale for level
    Point2i levelRes = LevelResolution(level);
    st[0] = st[0] * levelRes[0] - 0.5f;
    st[1] = st[1] * levelRes[1] - 0.5f;
    dst0[0] *= levelRes[0];
    dst0[1] *= levelRes[1];
    dst1[0] *= levelRes[0];
    dst1[1] *= levelRes[1];

    // Find ellipse coefficients that bound EWA filter region
    Float A = dst0[1] * dst0[1] + dst1[1] * dst1[1] + 1;
    Float B = -2 * (dst0[0] * dst0[1] + dst1[0] * dst1[1]);
    Float C = dst0[0] * dst0[0] + dst1[0] * dst1[0] + 1;
    Float invF = 1 / (A * C - B * B * 0.25f);
    A *= invF;
    B *= invF;
    C *= invF;

    // Compute the ellipse's $(s,t)$ bounding box in texture space
    Float det = -B * B + 4 * A * C;
    Float invDet = 1 / det;
    Float uSqrt = SafeSqrt(det * C), vSqrt = SafeSqrt(A * det);
    int s0 = std::ceil(st[0] - 2 * invDet * uSqrt);
    int s1 = std::floor(st[0] + 2 * invDet * uSqrt);
    int t0 = std::ceil(st[1] - 2 * invDet * vSqrt);
    int t1 = std::floor(st[1] + 2 * invDet * vSqrt);

    // Scan over ellipse bound and evaluate quadratic equation to filter image
    T sum{};
    Float sumWts = 0;
    for (int it = t0; it <= t1; ++it) {
        Float tt = it - st[1];
        for (int is = s0; is <= s1; ++is) {
            Float ss = is - st[0];
            // Compute squared radius and filter texel if it is inside the ellipse
            Float r2 = A * ss * ss + B * ss * tt + C * tt * tt;
            if (r2 < 1) {
                int index = std::min<int>(r2 * MIPFilterLUTSize, MIPFilterLUTSize - 1);
                Float weight = MIPFilterLUT[index];
                sum += weight * Texel<T>(level, {is, it});
                sumWts += weight;
            }
        }
    }
    return sum / sumWts;
}